

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void __thiscall benchmark::internal::BenchmarkImp::Arg(BenchmarkImp *this,int x)

{
  int iVar1;
  initializer_list<int> __l;
  allocator_type local_35;
  int local_34;
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  iVar1 = ArgsCnt(this);
  if (iVar1 != -1) {
    iVar1 = ArgsCnt(this);
    if (iVar1 != 1) {
      CheckHandler::CheckHandler
                ((CheckHandler *)&local_30,"ArgsCnt() == -1 || ArgsCnt() == 1",
                 "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
                 ,"Arg",0x204);
      CheckHandler::~CheckHandler((CheckHandler *)&local_30);
    }
  }
  GetNullLogInstance();
  __l._M_len = 1;
  __l._M_array = &local_34;
  local_34 = x;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_30,__l,&local_35);
  std::
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  ::emplace_back<std::vector<int,std::allocator<int>>>
            ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
              *)&this->args_,(vector<int,_std::allocator<int>_> *)&local_30);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

void BenchmarkImp::Arg(int x) {
  CHECK(ArgsCnt() == -1 || ArgsCnt() == 1);
  args_.push_back({x});
}